

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallFilesGenerator::GenerateScriptForConfig
          (cmInstallFilesGenerator *this,ostream *os,string *config,Indent *indent)

{
  cmLocalGenerator *lg;
  Snapshot snapshot;
  bool bVar1;
  cmCompiledGeneratorExpression *this_00;
  char *pcVar2;
  string local_1a8;
  allocator local_181;
  string local_180;
  string local_160;
  undefined1 local_140 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  const_iterator i;
  Snapshot local_d8;
  cmListFileBacktrace local_c0;
  undefined1 local_80 [8];
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmInstallFilesGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ge.Backtrace.Snapshot.Position.Position);
  cmState::Snapshot::Snapshot(&local_d8,(cmState *)0x0);
  cmCommandContext::cmCommandContext((cmCommandContext *)&i);
  snapshot.Position.Tree = local_d8.Position.Tree;
  snapshot.State = local_d8.State;
  snapshot.Position.Position = local_d8.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_c0,snapshot,(cmCommandContext *)&i);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_80,&local_c0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_c0);
  cmCommandContext::~cmCommandContext((cmCommandContext *)&i);
  local_120._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Files);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_118,&local_120);
  while( true ) {
    cge.x_ = (cmCompiledGeneratorExpression *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->Files);
    bVar1 = __gnu_cxx::operator!=
                      (&local_118,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&cge);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_118);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_140,(string *)local_80);
    local_140._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_140);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_140 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_140._8_8_);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_140);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)(local_140 + 0x10));
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_180);
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_180);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,pcVar2,&local_181);
    cmSystemTools::ExpandListArgument
              (&local_160,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ge.Backtrace.Snapshot.Position.Position,false);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string((string *)&local_180);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_140 + 0x10));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_118);
  }
  std::__cxx11::string::string((string *)&local_1a8,(string *)config);
  AddFilesInstallRule(this,os,&local_1a8,indent,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ge.Backtrace.Snapshot.Position.Position);
  std::__cxx11::string::~string((string *)&local_1a8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ge.Backtrace.Snapshot.Position.Position);
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptForConfig(std::ostream& os,
                                                    const std::string& config,
                                                    Indent const& indent)
{
  std::vector<std::string> files;
  cmGeneratorExpression ge;
  for(std::vector<std::string>::const_iterator i = this->Files.begin();
      i != this->Files.end(); ++i)
    {
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(cge->Evaluate(
        this->LocalGenerator, config), files);
    }
  this->AddFilesInstallRule(os, config, indent, files);
}